

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derTBITEnc(octet *der,u32 tag,octet *val,size_t len)

{
  octet *der_00;
  bool bVar1;
  bool_t bVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  byte bVar6;
  octet *dest;
  ulong len_00;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  
  uVar4 = (ulong)tag;
  bVar2 = derTIsValid(tag);
  if (bVar2 == 0) {
    return 0xffffffffffffffff;
  }
  lVar8 = 0;
  if (tag != 0) {
    do {
      lVar8 = lVar8 + 1;
      uVar3 = (uint)uVar4;
      uVar4 = uVar4 >> 8;
    } while (0xff < uVar3);
  }
  sVar9 = lVar8 + (ulong)(lVar8 == 0);
  len_00 = len + 0xf >> 3;
  sVar7 = 1;
  uVar4 = len_00;
  if (0x3ff < len + 0xf) {
    do {
      sVar7 = sVar7 + 1;
      bVar1 = 0xff < uVar4;
      uVar4 = uVar4 >> 8;
    } while (bVar1);
  }
  if (der != (octet *)0x0) {
    der_00 = der + sVar9;
    dest = der_00 + sVar7 + 1;
    memMove(dest,val,len + 7 >> 3);
    if ((len & 7) == 0) {
      bVar6 = 0;
    }
    else {
      bVar6 = 8 - (char)(len & 7);
      dest[len >> 3] = dest[len >> 3] & (byte)(-1 << (bVar6 & 0x1f));
    }
    der_00[sVar7] = bVar6;
    sVar5 = derTEnc(der,tag);
    if (sVar5 != sVar9) {
      return 0xffffffffffffffff;
    }
    sVar5 = derLEnc(der_00,len_00);
    if (sVar5 != sVar7) {
      return 0xffffffffffffffff;
    }
  }
  return sVar9 + len_00 + sVar7;
}

Assistant:

size_t derTBITEnc(octet der[], u32 tag, const octet* val, size_t len)
{
	size_t t_count;
	size_t l_count;
	// кодировать T
	t_count = derTEnc(0, tag);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать L
	l_count = derLEnc(0, (len + 15) / 8);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать
	if (der)
	{
		// V
		memMove(der + t_count + l_count + 1, val, (len + 7) / 8);
		if (len % 8)
		{
			der[t_count + l_count + 1 + len / 8] >>= 8 - len % 8;
			der[t_count + l_count + 1 + len / 8] <<= 8 - len % 8;
			der[t_count + l_count] = 8 - len % 8;
		}
		else
			der[t_count + l_count] = 0;
		// TL
		if (derTEnc(der, tag) != t_count ||
			derLEnc(der + t_count, (len + 15) / 8) != l_count)
			return SIZE_MAX;
	}
	return t_count + l_count + (len + 15) / 8;
}